

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O3

void UnityAssertEqualIntArray
               (void *expected,void *actual,UNITY_UINT32 num_elements,char *msg,
               UNITY_UINT lineNumber,UNITY_DISPLAY_STYLE_T style,UNITY_FLAGS_T flags)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  UNITY_DISPLAY_STYLE_T UVar4;
  ulong number;
  UNITY_UINT number_00;
  ulong uVar5;
  
  if (Unity.CurrentTestIgnored == 0 && Unity.CurrentTestFailed == 0) {
    if (num_elements == 0) {
      UnityTestResultsFailBegin(lineNumber);
      UnityPrint(" You Asked Me To Compare Nothing, Which Was Pointless.");
LAB_00101ae0:
      UnityAddMsgIfSpecified(msg);
LAB_00101ae5:
      Unity.CurrentTestFailed = 1;
      longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
    }
    if (expected != actual) {
      iVar2 = UnityIsOneArrayNull(expected,actual,lineNumber,msg);
      if (iVar2 != 0) goto LAB_00101ae5;
      UVar4 = style & 0xf;
      number_00 = 0;
      do {
        if (UVar4 == 8) {
          uVar5 = *expected;
          number = *actual;
          UVar4 = 8;
          bVar1 = false;
        }
        else {
          if (UVar4 == 2) {
            uVar5 = (ulong)(short)*expected;
            number = (ulong)(short)*actual;
            UVar4 = 2;
          }
          else if (UVar4 == 1) {
            uVar5 = (ulong)(char)*expected;
            number = (ulong)(char)*actual;
            UVar4 = 1;
          }
          else {
            uVar5 = (ulong)(int)*expected;
            number = (ulong)(int)*actual;
            UVar4 = 4;
          }
          bVar1 = true;
        }
        if (uVar5 != number) {
          if (bVar1 && (style & 0x20) != 0) {
            uVar3 = ~(-1L << ((byte)(UVar4 << 3) & 0x3f));
            uVar5 = uVar5 & uVar3;
            number = number & uVar3;
          }
          UnityTestResultsFailBegin(lineNumber);
          UnityPrint(" Element ");
          UnityPrintNumberUnsigned(number_00);
          UnityPrint(" Expected ");
          UnityPrintNumberByStyle(uVar5,style);
          UnityPrint(" Was ");
          UnityPrintNumberByStyle(number,style);
          goto LAB_00101ae0;
        }
        uVar5 = 0;
        if (flags == UNITY_ARRAY_TO_ARRAY) {
          uVar5 = (ulong)UVar4;
        }
        expected = (void *)((long)expected + uVar5);
        actual = (void *)((long)actual + (ulong)UVar4);
        number_00 = number_00 + 1;
      } while (num_elements != (UNITY_UINT32)number_00);
    }
  }
  return;
}

Assistant:

void UnityAssertEqualIntArray(UNITY_INTERNAL_PTR expected,
                              UNITY_INTERNAL_PTR actual,
                              const UNITY_UINT32 num_elements,
                              const char* msg,
                              const UNITY_LINE_TYPE lineNumber,
                              const UNITY_DISPLAY_STYLE_T style,
                              const UNITY_FLAGS_T flags)
{
    UNITY_UINT32 elements = num_elements;
    unsigned int length   = style & 0xF;

    RETURN_IF_FAIL_OR_IGNORE;

    if (num_elements == 0)
    {
        UnityPrintPointlessAndBail();
    }

    if (expected == actual) return; /* Both are NULL or same pointer */
    if (UnityIsOneArrayNull(expected, actual, lineNumber, msg))
        UNITY_FAIL_AND_BAIL;

    while (elements--)
    {
        UNITY_INT expect_val;
        UNITY_INT actual_val;
        switch (length)
        {
            case 1:
                expect_val = *(UNITY_PTR_ATTRIBUTE const UNITY_INT8*)expected;
                actual_val = *(UNITY_PTR_ATTRIBUTE const UNITY_INT8*)actual;
                break;
            case 2:
                expect_val = *(UNITY_PTR_ATTRIBUTE const UNITY_INT16*)expected;
                actual_val = *(UNITY_PTR_ATTRIBUTE const UNITY_INT16*)actual;
                break;
#ifdef UNITY_SUPPORT_64
            case 8:
                expect_val = *(UNITY_PTR_ATTRIBUTE const UNITY_INT64*)expected;
                actual_val = *(UNITY_PTR_ATTRIBUTE const UNITY_INT64*)actual;
                break;
#endif
            default: /* length 4 bytes */
                expect_val = *(UNITY_PTR_ATTRIBUTE const UNITY_INT32*)expected;
                actual_val = *(UNITY_PTR_ATTRIBUTE const UNITY_INT32*)actual;
                length = 4;
                break;
        }

        if (expect_val != actual_val)
        {
            if (style & UNITY_DISPLAY_RANGE_UINT && length < sizeof(expect_val))
            {   /* For UINT, remove sign extension (padding 1's) from signed type casts above */
                UNITY_INT mask = 1;
                mask = (mask << 8 * length) - 1;
                expect_val &= mask;
                actual_val &= mask;
            }
            UnityTestResultsFailBegin(lineNumber);
            UnityPrint(UnityStrElement);
            UnityPrintNumberUnsigned(num_elements - elements - 1);
            UnityPrint(UnityStrExpected);
            UnityPrintNumberByStyle(expect_val, style);
            UnityPrint(UnityStrWas);
            UnityPrintNumberByStyle(actual_val, style);
            UnityAddMsgIfSpecified(msg);
            UNITY_FAIL_AND_BAIL;
        }
        if (flags == UNITY_ARRAY_TO_ARRAY)
        {
            expected = (UNITY_INTERNAL_PTR)(length + (const char*)expected);
        }
        actual   = (UNITY_INTERNAL_PTR)(length + (const char*)actual);
    }
}